

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O1

void __thiscall Disa::Adjacency_Graph<false>::resize(Adjacency_Graph<false> *this,size_t *size)

{
  size_type __new_size;
  unsigned_long uVar1;
  ulong *puVar2;
  pointer puVar3;
  pointer puVar4;
  difference_type __d_1;
  difference_type __d;
  size_t __n;
  long lVar5;
  ulong uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong uVar7;
  ulong uVar8;
  ulong *__dest;
  long lVar9;
  unsigned_long local_38;
  
  puVar3 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  if (puVar4 != puVar3) {
    uVar6 = ((long)puVar4 - (long)puVar3 >> 3) - 1;
  }
  this_00 = &this->offset;
  __new_size = *size + 1;
  if (uVar6 < *size) {
    puVar4 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar3 == puVar4) {
      local_38 = 0;
    }
    else {
      local_38 = puVar4[-1];
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,__new_size,&local_38)
    ;
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,__new_size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->vertex_adjacent_list,
               (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1]);
    puVar3 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)puVar4 - (long)puVar3 != 8 && puVar4 != puVar3) {
      lVar9 = 0;
      uVar6 = 0;
      do {
        puVar4 = (this->vertex_adjacent_list).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = puVar3[uVar6 + 1];
        __dest = puVar4 + puVar3[uVar6];
        uVar7 = (long)(uVar1 * 8 + puVar3[uVar6] * -8) >> 3;
        if (0 < (long)uVar7) {
          do {
            uVar8 = uVar7 >> 1;
            uVar7 = ~uVar8 + uVar7;
            puVar2 = __dest + uVar8 + 1;
            if (*size <= __dest[uVar8]) {
              uVar7 = uVar8;
              puVar2 = __dest;
            }
            __dest = puVar2;
          } while (0 < (long)uVar7);
        }
        puVar2 = puVar4 + uVar1;
        if (__dest != puVar2) {
          __n = (long)(this->vertex_adjacent_list).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2;
          if (__n != 0) {
            memmove(__dest,puVar4 + uVar1,__n);
          }
          puVar3 = (this->vertex_adjacent_list).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar4 = (pointer)(((long)puVar3 - (long)puVar2) + (long)__dest);
          if (puVar3 != puVar4) {
            (this->vertex_adjacent_list).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar4;
          }
          lVar5 = (long)puVar2 - (long)__dest >> 3;
          puVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar6 + 1;
          *puVar3 = *puVar3 - lVar5;
          lVar9 = lVar9 + lVar5;
        }
        puVar3 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar6 + 2;
        *puVar3 = *puVar3 - lVar9;
        puVar3 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(this->offset).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3;
      } while ((lVar5 != 0) && (uVar6 = uVar6 + 1, uVar6 < (lVar5 >> 3) - 1U));
    }
  }
  return;
}

Assistant:

void Adjacency_Graph<_directed>::resize(const std::size_t& size) {

  // Branch based on expansion or contraction of the graph.
  if(size_vertex() < size) {
    offset.resize(size + 1, offset.empty() ? 0 : offset.back());
  } else {
    // Resize the containers.
    offset.resize(size + 1);
    vertex_adjacent_list.resize(offset.back());

    // Loop over remaining vertices, looking for edges which no longer exist.
    std::size_t offset_carry = 0;
    FOR(i_vertex, size_vertex()) {
      auto [adjacency_begin, adjacency_end] = vertex_adjacency_iter(i_vertex);
      const auto erase_iter = std::lower_bound(adjacency_begin, adjacency_end, size);
      if(erase_iter != adjacency_end) {
        const auto offset_current = std::distance(erase_iter, adjacency_end);
        vertex_adjacent_list.erase(erase_iter, adjacency_end);
        offset[i_vertex + 1] -= offset_current;
        offset_carry += offset_current;
      }
      offset[i_vertex + 2] -= offset_carry;
    }
  }
}